

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O1

void __thiscall
gimage::Polygon::getVEdges
          (Polygon *this,vector<gimage::VEdge,_std::allocator<gimage::VEdge>_> *list)

{
  ulong uVar1;
  VEdge *pVVar2;
  iterator __position;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  __first;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  __last;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  VEdge *pVVar10;
  pointer pSVar11;
  ulong uVar12;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  __i;
  VEdge *pVVar13;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  _Var14;
  long lVar15;
  __normal_iterator<gimage::VEdge_*,_std::vector<gimage::VEdge,_std::allocator<gimage::VEdge>_>_>
  _Var16;
  ulong uVar17;
  size_t __n;
  VEdge v;
  VEdge local_58;
  
  if (*(long *)(list + 8) != *(long *)list) {
    *(long *)(list + 8) = *(long *)list;
  }
  pSVar11 = (this->vertex).
            super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->vertex).
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pSVar11) {
    lVar15 = 8;
    uVar12 = ((long)(this->vertex).
                    super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vertex).
                    super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) - 1;
    uVar17 = 0;
    do {
      VEdge::VEdge(&local_58,*(long *)((long)pSVar11->v + lVar15 + -8),
                   *(long *)((long)pSVar11->v + lVar15),pSVar11[uVar12].v[0],pSVar11[uVar12].v[1]);
      if (local_58.ymin < local_58.ymax) {
        __position._M_current = *(VEdge **)(list + 8);
        if (__position._M_current == *(VEdge **)(list + 0x10)) {
          std::vector<gimage::VEdge,std::allocator<gimage::VEdge>>::
          _M_realloc_insert<gimage::VEdge_const&>
                    ((vector<gimage::VEdge,std::allocator<gimage::VEdge>> *)list,__position,
                     &local_58);
        }
        else {
          (__position._M_current)->xc = local_58.xc;
          (__position._M_current)->xstart = local_58.xstart;
          (__position._M_current)->xend = local_58.xend;
          (__position._M_current)->ymin = local_58.ymin;
          (__position._M_current)->ymax = local_58.ymax;
          *(long *)(list + 8) = *(long *)(list + 8) + 0x28;
        }
      }
      uVar1 = uVar17 + 1;
      pSVar11 = (this->vertex).
                super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x10;
      uVar12 = uVar17;
      uVar17 = uVar1;
    } while (uVar1 < (ulong)((long)(this->vertex).
                                   super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11 >> 4))
    ;
  }
  __first._M_current = *(VEdge **)list;
  __last._M_current = *(VEdge **)(list + 8);
  if (__first._M_current != __last._M_current) {
    uVar12 = ((long)__last._M_current - (long)__first._M_current >> 3) * -0x3333333333333333;
    lVar15 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar15 == 0; lVar15 = lVar15 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<gimage::VEdge*,std::vector<gimage::VEdge,std::allocator<gimage::VEdge>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(gimage::VEdge_const&,gimage::VEdge_const&)>>
              (__first,__last,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_gimage::VEdge_&,_const_gimage::VEdge_&)>)0x1452ac);
    _Var16._M_current = __first._M_current;
    if ((long)__last._M_current - (long)__first._M_current < 0x281) {
      while (pVVar13 = _Var16._M_current + 1, pVVar13 != __last._M_current) {
        lVar15 = _Var16._M_current[1].ymin;
        if (lVar15 < (__first._M_current)->ymin) {
          local_58.xc = pVVar13->xc;
          local_58.ymin = pVVar13->ymin;
          local_58.ymax = pVVar13->ymax;
          local_58.xstart = pVVar13->xstart;
          local_58.xend = pVVar13->xend;
          memmove((void *)((long)_Var16._M_current +
                          (0x50 - ((long)pVVar13 - (long)__first._M_current))),__first._M_current,
                  (long)pVVar13 - (long)__first._M_current);
          (__first._M_current)->ymin = local_58.ymin;
          (__first._M_current)->ymax = local_58.ymax;
          (__first._M_current)->xstart = local_58.xstart;
          (__first._M_current)->xend = local_58.xend;
          (__first._M_current)->xc = local_58.xc;
          _Var16._M_current = pVVar13;
        }
        else {
          lVar4 = pVVar13->ymax;
          lVar5 = pVVar13->xstart;
          lVar6 = pVVar13->xend;
          lVar7 = pVVar13->xc;
          lVar3 = (_Var16._M_current)->ymin;
          pVVar2 = pVVar13;
          while (lVar15 < lVar3) {
            pVVar2->xc = pVVar2[-1].xc;
            lVar3 = pVVar2[-1].ymin;
            lVar8 = pVVar2[-1].ymax;
            lVar9 = pVVar2[-1].xend;
            pVVar2->xstart = pVVar2[-1].xstart;
            pVVar2->xend = lVar9;
            pVVar2->ymin = lVar3;
            pVVar2->ymax = lVar8;
            lVar3 = pVVar2[-2].ymin;
            pVVar2 = pVVar2 + -1;
          }
          pVVar2->ymin = lVar15;
          pVVar2->ymax = lVar4;
          pVVar2->xstart = lVar5;
          pVVar2->xend = lVar6;
          pVVar2->xc = lVar7;
          _Var16._M_current = pVVar13;
        }
      }
    }
    else {
      __n = 0x28;
      _Var14._M_current = __first._M_current;
      do {
        _Var16._M_current = _Var16._M_current + 1;
        pVVar13 = (VEdge *)((long)&(__first._M_current)->ymin + __n);
        lVar15 = *(long *)((long)&(__first._M_current)->ymin + __n);
        if (lVar15 < (__first._M_current)->ymin) {
          local_58.xc = pVVar13->xc;
          local_58.ymin = pVVar13->ymin;
          local_58.ymax = pVVar13->ymax;
          local_58.xstart = pVVar13->xstart;
          local_58.xend = pVVar13->xend;
          memmove((void *)((long)_Var14._M_current + (0x50 - __n)),__first._M_current,__n);
          (__first._M_current)->ymin = local_58.ymin;
          (__first._M_current)->ymax = local_58.ymax;
          (__first._M_current)->xstart = local_58.xstart;
          (__first._M_current)->xend = local_58.xend;
          (__first._M_current)->xc = local_58.xc;
        }
        else {
          lVar4 = pVVar13->ymax;
          lVar5 = pVVar13->xstart;
          lVar6 = pVVar13->xend;
          lVar7 = pVVar13->xc;
          lVar3 = (_Var14._M_current)->ymin;
          pVVar2 = pVVar13;
          pVVar10 = _Var16._M_current;
          while (lVar15 < lVar3) {
            pVVar2 = pVVar10 + -1;
            pVVar10->xc = pVVar10[-1].xc;
            lVar3 = pVVar10[-1].ymin;
            lVar8 = pVVar10[-1].ymax;
            lVar9 = pVVar10[-1].xend;
            pVVar10->xstart = pVVar10[-1].xstart;
            pVVar10->xend = lVar9;
            pVVar10->ymin = lVar3;
            pVVar10->ymax = lVar8;
            lVar3 = pVVar10[-2].ymin;
            pVVar10 = pVVar2;
          }
          pVVar2->ymin = lVar15;
          pVVar2->ymax = lVar4;
          pVVar2->xstart = lVar5;
          pVVar2->xend = lVar6;
          pVVar2->xc = lVar7;
        }
        __n = __n + 0x28;
        _Var14._M_current = pVVar13;
      } while (__n != 0x280);
      for (pVVar13 = __first._M_current + 0x10; pVVar13 != __last._M_current; pVVar13 = pVVar13 + 1)
      {
        lVar15 = pVVar13->ymin;
        lVar4 = pVVar13->xend;
        lVar5 = pVVar13->xc;
        lVar6 = pVVar13->ymax;
        lVar7 = pVVar13->xstart;
        lVar3 = pVVar13[-1].ymin;
        pVVar2 = pVVar13;
        while (lVar15 < lVar3) {
          pVVar2->xc = pVVar2[-1].xc;
          lVar3 = pVVar2[-1].ymin;
          lVar8 = pVVar2[-1].ymax;
          lVar9 = pVVar2[-1].xend;
          pVVar2->xstart = pVVar2[-1].xstart;
          pVVar2->xend = lVar9;
          pVVar2->ymin = lVar3;
          pVVar2->ymax = lVar8;
          lVar3 = pVVar2[-2].ymin;
          pVVar2 = pVVar2 + -1;
        }
        pVVar2->ymin = lVar15;
        pVVar2->ymax = lVar6;
        pVVar2->xstart = lVar7;
        pVVar2->xend = lVar4;
        pVVar2->xc = lVar5;
      }
    }
  }
  return;
}

Assistant:

void Polygon::getVEdges(std::vector<VEdge> &list) const
{
  list.clear();

  size_t j=vertex.size()-1;
  for (size_t i=0; i<vertex.size(); i++)
  {
    VEdge v(vertex[i][0], vertex[i][1], vertex[j][0], vertex[j][1]);

    if (v.isValid())
    {
      list.push_back(v);
    }

    j=i;
  }

  std::sort(list.begin(), list.end(), compareY);
}